

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O1

ostream * pstack::Procman::operator<<(ostream *os,SigInfo *sip)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  ostream *poVar8;
  long lVar9;
  _Base_ptr p_Var10;
  undefined8 *puVar11;
  pair<const_int,_const_char_*> *ppVar12;
  byte bVar13;
  initializer_list<std::pair<const_int,_const_char_*>_> __l;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_00;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_01;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_02;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_03;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_04;
  initializer_list<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
  __l_05;
  pair<const_int,_const_char_*> local_660 [16];
  pair<const_int,_const_char_*> local_560 [7];
  pair<const_int,_const_char_*> local_4f0 [10];
  pair<const_int,_const_char_*> local_450 [5];
  pair<const_int,_const_char_*> local_400 [5];
  pair<const_int,_const_char_*> local_3b0 [9];
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_320;
  undefined4 local_2e8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_2e0;
  undefined4 local_2b0;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_2a8;
  undefined4 local_278;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_270;
  undefined4 local_240;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_238;
  undefined4 local_208;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_200;
  undefined4 local_1d0;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_1c8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_198;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_168;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_138;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_108;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_d8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_a8;
  _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_78;
  less<int> local_3e;
  allocator_type local_3d;
  less<int> local_3c;
  allocator_type local_3b;
  less<int> local_3a;
  allocator_type local_39;
  less<int> local_38;
  allocator_type local_37;
  less<int> local_36;
  allocator_type local_35;
  less<int> local_34;
  allocator_type local_33;
  less<int> local_32;
  allocator_type local_31;
  
  bVar13 = 0;
  uVar1 = sip->si->si_signo;
  iVar2 = sip->si->si_code;
  if ((operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes == '\0') &&
     (iVar3 = __cxa_guard_acquire(&operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes)
     , iVar3 != 0)) {
    puVar11 = &DAT_0013f798;
    ppVar12 = local_560;
    for (lVar9 = 0xe; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)ppVar12 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      ppVar12 = (pair<const_int,_const_char_*> *)&ppVar12[-(ulong)bVar13].second;
    }
    __l._M_len = 7;
    __l._M_array = local_560;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         *)&local_198,__l,&local_3e,&local_3d);
    local_320.first = 0xb;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_320.second._M_t,&local_198);
    memcpy(local_660,&DAT_0013f808,0x100);
    __l_00._M_len = 0x10;
    __l_00._M_array = local_660;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         *)&local_168,__l_00,&local_3c,&local_3b);
    local_2e8 = 0;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_2e0,&local_168);
    memcpy(local_3b0,&DAT_0013f908,0x90);
    __l_01._M_len = 9;
    __l_01._M_array = local_3b0;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         *)&local_138,__l_01,&local_3a,&local_39);
    local_2b0 = 4;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_2a8,&local_138);
    memcpy(local_4f0,&DAT_0013f998,0xa0);
    __l_02._M_len = 10;
    __l_02._M_array = local_4f0;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         *)&local_108,__l_02,&local_38,&local_37);
    local_278 = 8;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_270,&local_108);
    puVar11 = &DAT_0013fa38;
    ppVar12 = local_450;
    for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)ppVar12 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      ppVar12 = (pair<const_int,_const_char_*> *)&ppVar12[-(ulong)bVar13].second;
    }
    __l_03._M_len = 5;
    __l_03._M_array = local_450;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         *)&local_d8,__l_03,&local_36,&local_35);
    local_240 = 7;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_238,&local_d8);
    puVar11 = &DAT_0013fa88;
    ppVar12 = local_400;
    for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)ppVar12 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      ppVar12 = (pair<const_int,_const_char_*> *)&ppVar12[-(ulong)bVar13].second;
    }
    __l_04._M_len = 5;
    __l_04._M_array = local_400;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         *)&local_a8,__l_04,&local_34,&local_33);
    local_208 = 5;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_200,&local_a8);
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl._0_8_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1d0 = 0x1f;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::_Rb_tree(&local_1c8,&local_78);
    __l_05._M_len = 7;
    __l_05._M_array = &local_320;
    std::
    map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
    ::map(&operator<<::codes,__l_05,&local_32,&local_31);
    lVar9 = 0x158;
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                   *)((long)&local_320.first + lVar9));
      lVar9 = lVar9 + -0x38;
    } while (lVar9 != -0x30);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_78);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_a8);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_d8);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_108);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_138);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_168);
    std::
    _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
    ::~_Rb_tree(&local_198);
    __cxa_atexit(std::
                 map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
                 ::~map,&operator<<::codes,&__dso_handle);
    __cxa_guard_release(&operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes);
  }
  pcVar4 = (char *)sigdescr_np(uVar1);
  iVar3 = (int)os;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," SIG",4);
  pcVar4 = (char *)sigabbrev_np(uVar1);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,", si_code ",10);
  std::ostream::operator<<(os,iVar2);
  p_Var10 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header;
  if (operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var10 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)uVar1 <= (int)p_Var6[1]._M_color) {
        p_Var10 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)uVar1];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  p_Var6 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header;
  if (((_Rb_tree_header *)p_Var10 != &operator<<::codes._M_t._M_impl.super__Rb_tree_header) &&
     (p_Var6 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header,
     (int)p_Var10[1]._M_color <= (int)uVar1)) {
    p_Var6 = p_Var10;
  }
  if ((_Rb_tree_header *)p_Var6 == &operator<<::codes._M_t._M_impl.super__Rb_tree_header) {
    p_Var10 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header;
    if (operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
    {
      p_Var10 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (-1 < (int)p_Var6[1]._M_color) {
          p_Var10 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[p_Var6[1]._M_color >> 0x1f];
      } while (p_Var6 != (_Base_ptr)0x0);
    }
    p_Var6 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header;
    if (((_Rb_tree_header *)p_Var10 != &operator<<::codes._M_t._M_impl.super__Rb_tree_header) &&
       (p_Var6 = &operator<<::codes._M_t._M_impl.super__Rb_tree_header._M_header,
       (int)p_Var10[1]._M_color < 1)) {
      p_Var6 = p_Var10;
    }
  }
  if ((_Rb_tree_header *)p_Var6 != &operator<<::codes._M_t._M_impl.super__Rb_tree_header) {
    pp_Var7 = &p_Var6[1]._M_left;
    p_Var10 = p_Var6[1]._M_right;
    p_Var6 = (_Base_ptr)pp_Var7;
    for (; p_Var10 != (_Base_ptr)0x0;
        p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < iVar2]) {
      if (iVar2 <= (int)p_Var10[1]._M_color) {
        p_Var6 = p_Var10;
      }
    }
    p_Var10 = (_Base_ptr)pp_Var7;
    if ((p_Var6 != (_Base_ptr)pp_Var7) && (p_Var10 = p_Var6, iVar2 < (int)p_Var6[1]._M_color)) {
      p_Var10 = (_Base_ptr)pp_Var7;
    }
    if (p_Var10 != (_Base_ptr)pp_Var7) {
      std::__ostream_insert<char,std::char_traits<char>>(os," - ",3);
      p_Var10 = p_Var10[1]._M_parent;
      if (p_Var10 == (_Base_ptr)0x0) {
        std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
      }
      else {
        sVar5 = strlen((char *)p_Var10);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)p_Var10,sVar5);
      }
    }
  }
  if ((uVar1 < 0xc) && ((0x9b0U >> (uVar1 & 0x1f) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", fault address ",0x10);
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar8 = std::ostream::_M_insert<void_const*>(os);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, const SigInfo &sip) {
   const auto si = sip.si;

   static std::map<int, std::map<int, const char *>> codes {
         { SIGSEGV,  {
                     { SEGV_MAPERR, "address not mapped to object" },
                        { SEGV_ACCERR, "invalid permissions for mapped object" },
                        { SEGV_BNDERR, "address failed bouds checks" },
                        { SEGV_ACCADI, "ADI not enabled" },
                        { SEGV_ADIDERR, "disrupting MCD error" },
                        { SEGV_ADIPERR, "precise MCD exception" },
                        { SEGV_MTEAERR, "asynchronous ARM MTE error" },
                  } },
         { 0,     {
                     { SI_USER, "sent by kill/sigsend/raise" },
                     { SI_KERNEL, "sent by kernel" },
                     { SI_QUEUE, "sent by sigqueue" },
                     { SI_TIMER, "sent by timer expiration" },
                     { SI_MESGQ, "sent by real time mesq state change" },
                     { SI_ASYNCIO, "sent by AIO completion" },
                     { SI_SIGIO, "sent by queued SIGIO" },
                     { SI_TKILL, "sent by tkill syscall" },
                     { SI_DETHREAD, "sent by execve killing subsidiary threads" },
                     { SI_ASYNCNL, "sent by glibc async name lookup completion" },
                     { POLL_IN, "data input available" },
                     { POLL_OUT, "output buffers available" },
                     { POLL_MSG, "input message available" },
                     { POLL_ERR, "I/O error" },
                     { POLL_PRI, "high priority input available" },
                     { POLL_HUP, "device disconnected" },
                  } },
         { SIGILL, {
                      { ILL_ILLOPC, "illegal opcode" },
                      { ILL_ILLOPN, "illegal operand" },
                      { ILL_ILLADR, "illegal address mode" },
                      { ILL_ILLTRP, "illegal trap" },
                      { ILL_PRVOPC, "privileged opcode" },
                      { ILL_PRVREG, "privileged register" },
                      { ILL_COPROC, "coprocessor error" },
                      { ILL_BADSTK, "internal stack error" },
                      { ILL_BADIADDR, "unimplemented instruction address" },
                      /*
                      { __ILL_BREAK, "illegal break" },
                      { __ILL_BNDMOD, "bundle-pudate (modification) in proress" }
                      */
                   } },
         { SIGFPE, {
                      { FPE_INTDIV, "integer divide by zero" },
                      { FPE_INTOVF, "integer overflow" },
                      { FPE_FLTDIV, "floating point divide by zero" },
                      { FPE_FLTOVF, "floating point overflow" },
                      { FPE_FLTUND, "floating point underflow" },
                      { FPE_FLTRES, "floating point inexact result" },
                      { FPE_FLTINV, "floating point invalid operation" },
                      { FPE_FLTSUB, "subscript out of range" },
                      /*
                      { __FPE_DECOVF, "decimal overflow" },
                      { __FPE_DECDIV, "decimal division" },
                      { __FPE_DECERR, "packed decimal error" },
                      { __FPE_INVASC, "invalid ASCII digit" },
                      { __FPE_INVDEC, "invalid decimal digit" },
                      */
                      { FPE_FLTUNK, "undiagnosed floating point exception" },
                      { FPE_CONDTRAP, "trap condition" },
                   } },
         { SIGBUS, {
                      { BUS_ADRALN, "invalid address alignment" },
                      { BUS_ADRERR, "non-existent physical address" },
                      { BUS_OBJERR, "object specific hardware error" },
                      { BUS_MCEERR_AR, "hardware memory error consumed on a machine check: action required" },
                      { BUS_MCEERR_AO, "hardware memory error consumed on a machine check: action optional" },
                   }
         },
         { SIGTRAP, {
                       { TRAP_BRKPT, "process breakpoint" },
                       { TRAP_TRACE, "process trace trap" },
                       { TRAP_BRANCH, "process taken branch trap" },
                       { TRAP_HWBKPT, "hardware breakpoint/watchpoint" },
                       { TRAP_UNK, "undiagnosed trap" },
                       /*
                       { TRAP_PERF, "perf event with sigtrap=1" },
                       */
                    }
         },
         {  SIGSYS, {
                       /*
                       { SYS_SECCOMP, "seccomp triggered" },
                       { SYS_USER_DISPATCH, "syscall user dispatch triggered" }
                       */
                    }
         },
   };

   os << sigdescr_np( si.si_signo )
      << " SIG" << sigabbrev_np( si.si_signo )
      << ", si_code " << si.si_code;

   auto codesforsig = codes.find( si.si_signo );
   if (codesforsig == codes.end()) {
      codesforsig = codes.find( 0 );
   }

   if (codesforsig != codes.end()) {
      auto code = codesforsig->second.find( si.si_code );
      if (code != codesforsig->second.end())
            os << " - " << code->second;
   }

   switch (si.si_signo) {
      case SIGILL:
      case SIGFPE:
      case SIGBUS:
      case SIGTRAP:
#ifdef SIGEMT
      case SIGEMT:
#endif
      case SIGSEGV: {
         os << ", fault address " << std::hex << si.si_addr << std::dec;
         break;
      }


   }
   return os;
}